

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O3

int Sim_UtilCountPairsOnePrint(Extra_BitMat_t *pMat,Vec_Int_t *vSupport)

{
  uint i;
  uint k;
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  iVar1 = vSupport->nSize;
  if (0 < iVar1) {
    lVar5 = 1;
    lVar4 = 0;
    do {
      lVar3 = lVar4 + 1;
      lVar2 = (long)iVar1;
      if (lVar3 < lVar2) {
        i = vSupport->pArray[lVar4];
        lVar4 = lVar5;
        do {
          k = vSupport->pArray[lVar4];
          iVar1 = Extra_BitMatrixLookup1(pMat,i,k);
          if (iVar1 != 0) {
            printf("(%d,%d) ",(ulong)i,(ulong)k);
          }
          lVar4 = lVar4 + 1;
          iVar1 = vSupport->nSize;
        } while ((int)lVar4 < iVar1);
        lVar2 = (long)iVar1;
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar3;
    } while (lVar3 < lVar2);
  }
  return 0;
}

Assistant:

int Sim_UtilCountPairsOnePrint( Extra_BitMat_t * pMat, Vec_Int_t * vSupport )
{
    int i, k, Index1, Index2;
    Vec_IntForEachEntry( vSupport, i, Index1 )
    Vec_IntForEachEntryStart( vSupport, k, Index2, Index1+1 )
        if ( Extra_BitMatrixLookup1( pMat, i, k ) )
            printf( "(%d,%d) ", i, k );
    return 0;
}